

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::leaveModal(QGraphicsScenePrivate *this,QGraphicsItem *panel)

{
  long *plVar1;
  undefined8 uVar2;
  bool bVar3;
  Node<QGraphicsItem_*,_QHashDummyValue> *pNVar4;
  long lVar5;
  long lVar6;
  QGraphicsItem **item;
  long lVar7;
  QGraphicsItem **key;
  long in_FS_OFFSET;
  QGraphicsItem *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_58;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_48;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)&this->field_0x8;
  local_48.d = (Data *)0x0;
  local_58.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(*(long *)(lVar6 + 8) + 0x88);
  (**(code **)(*plVar1 + 0x60))(local_68,plVar1,1);
  uVar2 = local_68._8_8_;
  if (local_58.d != (QGraphicsSceneEventPrivate *)0x0) {
    lVar7 = (long)local_58.d << 3;
    lVar5 = 0;
    do {
      bVar3 = QGraphicsItem::isPanel(*(QGraphicsItem **)(uVar2 + lVar5));
      if (bVar3) {
        bVar3 = QGraphicsItem::isBlockedByModalPanel
                          (*(QGraphicsItem **)(uVar2 + lVar5),(QGraphicsItem **)0x0);
        if (bVar3) {
          local_78 = *(QGraphicsItem **)(uVar2 + lVar5);
          QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_48,&local_78,&local_39);
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar7 != lVar5);
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,8,0x10);
    }
  }
  local_68._0_8_ = &local_78;
  local_78 = panel;
  QtPrivate::
  sequential_erase_if<QList<QGraphicsItem*>,QtPrivate::sequential_erase<QList<QGraphicsItem*>,QGraphicsItem*>(QList<QGraphicsItem*>&,QGraphicsItem*const&)::_lambda(auto:1_const&)_1_>
            (&this->modalPanels,(anon_class_8_1_54a39814_for__M_pred *)local_68);
  local_78 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_78,WindowUnblocked);
  local_58.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(*(long *)(lVar6 + 8) + 0x88);
  (**(code **)(*plVar1 + 0x60))(local_68,plVar1,1);
  if (local_58.d != (QGraphicsSceneEventPrivate *)0x0) {
    lVar6 = (long)local_58.d << 3;
    key = (QGraphicsItem **)local_68._8_8_;
    do {
      bVar3 = QGraphicsItem::isPanel(*key);
      if ((bVar3) && (local_48.d != (Data *)0x0)) {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::
                 findNode<QGraphicsItem*>
                           ((Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *)local_48.d,
                            key);
        if (pNVar4 != (Node<QGraphicsItem_*,_QHashDummyValue> *)0x0) {
          bVar3 = QGraphicsItem::isBlockedByModalPanel(*key,(QGraphicsItem **)0x0);
          if (!bVar3) {
            sendEvent(this,*key,(QEvent *)&local_78);
          }
        }
      }
      key = key + 1;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,8,0x10);
    }
  }
  QEvent::~QEvent((QEvent *)&local_78);
  local_58.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)local_68,None);
  QGraphicsSceneHoverEvent::setScenePos
            ((QGraphicsSceneHoverEvent *)local_68,&this->lastSceneMousePos);
  dispatchHoverEvent(this,(QGraphicsSceneHoverEvent *)local_68);
  QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_68);
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::leaveModal(QGraphicsItem *panel)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }

    modalPanels.removeAll(panel);

    {
        QEvent e(QEvent::WindowUnblocked);
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && blockedPanels.contains(item) && !item->isBlockedByModalPanel())
                sendEvent(item, &e);
        }
    }

    // send GraphicsSceneHoverEnter events to newly unblocked items
    QGraphicsSceneHoverEvent hoverEvent;
    hoverEvent.setScenePos(lastSceneMousePos);
    dispatchHoverEvent(&hoverEvent);
}